

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void V_DrawBorder(int x1,int y1,int x2,int y2)

{
  FTextureID FVar1;
  undefined8 in_RAX;
  uint uVar2;
  FString name;
  FTexture *pFVar3;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  if ((level.info == (level_info_t *)0x0) ||
     (name.Chars = ((level.info)->BorderTexture).Chars, *(int *)(name.Chars + -0xc) == 0)) {
    name.Chars = gameinfo.BorderFlat.Chars;
  }
  FVar1 = FTextureManager::CheckForTexture(&TexMan,name.Chars,2,1);
  if (FVar1.texnum < 1) {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)x2,(ulong)(uint)y2,0,
               (ulong)uVar2 << 0x20);
  }
  else {
    if ((uint)FVar1.texnum < TexMan.Textures.Count) {
      pFVar3 = TexMan.Textures.Array[TexMan.Translation.Array[(uint)FVar1.texnum]].Texture;
    }
    else {
      pFVar3 = (FTexture *)0x0;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
              (screen,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)x2,(ulong)(uint)y2,pFVar3,
               (ulong)uVar2 << 0x20);
  }
  return;
}

Assistant:

void V_DrawBorder (int x1, int y1, int x2, int y2)
{
	FTextureID picnum;

	if (level.info != NULL && level.info->BorderTexture.Len() != 0)
	{
		picnum = TexMan.CheckForTexture (level.info->BorderTexture, FTexture::TEX_Flat);
	}
	else
	{
		picnum = TexMan.CheckForTexture (gameinfo.BorderFlat, FTexture::TEX_Flat);
	}

	if (picnum.isValid())
	{
		screen->FlatFill (x1, y1, x2, y2, TexMan(picnum));
	}
	else
	{
		screen->Clear (x1, y1, x2, y2, 0, 0);
	}
}